

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
csv::internals::_get_col_names_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,internals *this,string_view head,CSVFormat *format)

{
  _Ios_Openmode _Var1;
  int iVar2;
  const_pointer __s;
  CSVRow *pCVar3;
  CSVFormat *this_00;
  CSVRow local_a18;
  shared_ptr<csv::internals::ColNames> local_9f0;
  undefined1 local_9e0 [8];
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parser;
  RowCollection rows;
  allocator<char> local_1e9;
  string local_1e8 [32];
  stringstream local_1c8 [8];
  stringstream source;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> trim_chars;
  CSVFormat *format_local;
  string_view head_local;
  
  this_00 = (CSVFormat *)head._M_str;
  head_local._M_len = head._M_len;
  trim_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = this_00;
  format_local = (CSVFormat *)this;
  head_local._M_str = (char *)__return_storage_ptr__;
  CSVFormat::get_trim_chars((vector<char,_std::allocator<char>_> *)local_40,this_00);
  __s = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)&format_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,__s,&local_1e9);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1c8,local_1e8,_Var1);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  ThreadSafeDeque<csv::CSVRow>::ThreadSafeDeque
            ((ThreadSafeDeque<csv::CSVRow> *)&parser.stream_pos,100);
  std::shared_ptr<csv::internals::ColNames>::shared_ptr(&local_9f0,(nullptr_t)0x0);
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::StreamParser((StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_9e0,
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c8,this_00,&local_9f0);
  std::shared_ptr<csv::internals::ColNames>::~shared_ptr(&local_9f0);
  IBasicCSVParser::set_output((IBasicCSVParser *)local_9e0,(RowCollection *)&parser.stream_pos);
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::next((StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_9e0,10000000);
  iVar2 = CSVFormat::get_header(this_00);
  pCVar3 = ThreadSafeDeque<csv::CSVRow>::operator[]
                     ((ThreadSafeDeque<csv::CSVRow> *)&parser.stream_pos,(long)iVar2);
  CSVRow::CSVRow(&local_a18,pCVar3);
  CSVRow::operator_cast_to_vector(__return_storage_ptr__,&local_a18);
  CSVRow::~CSVRow(&local_a18);
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~StreamParser((StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_9e0);
  ThreadSafeDeque<csv::CSVRow>::~ThreadSafeDeque((ThreadSafeDeque<csv::CSVRow> *)&parser.stream_pos)
  ;
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE std::vector<std::string> _get_col_names(csv::string_view head, CSVFormat format) {
            // Parse the CSV
            auto trim_chars = format.get_trim_chars();
            std::stringstream source(head.data());
            RowCollection rows;

            StreamParser<std::stringstream> parser(source, format);
            parser.set_output(rows);
            parser.next();

            return CSVRow(std::move(rows[format.get_header()]));
        }